

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall QDockWidgetLayout::setGeometry(QDockWidgetLayout *this,QRect *geometry)

{
  QList<QLayoutItem_*> *this_00;
  QLayoutItem *pQVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  QWidget *this_01;
  QStyle *pQVar9;
  pointer ppQVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  QStyleOptionDockWidget opt;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  this_01 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  bVar6 = nativeWindowDeco(this);
  iVar7 = 0;
  if ((!bVar6) &&
     (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    pQVar9 = QWidget::style(this_01);
    iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x12,0,this_01);
  }
  if (bVar6) {
    ppQVar10 = QList<QLayoutItem_*>::data(&this->item_list);
    pQVar1 = *ppQVar10;
    if (pQVar1 != (QLayoutItem *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*pQVar1->_vptr_QLayoutItem[6])(pQVar1,geometry);
        return;
      }
      goto LAB_00406987;
    }
  }
  else {
    iVar8 = titleHeight(this);
    if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
      iVar11 = iVar8 + iVar7 + -1;
      iVar8 = ((geometry->y2).m_i - iVar7) - (geometry->y1).m_i;
    }
    else {
      iVar11 = ((geometry->x2).m_i - iVar7) - (geometry->x1).m_i;
      iVar8 = iVar8 + iVar7 + -1;
    }
    (this->_titleArea).x1.m_i = iVar7;
    (this->_titleArea).y1.m_i = iVar7;
    (this->_titleArea).x2.m_i = iVar11;
    (this->_titleArea).y2.m_i = iVar8;
    this_00 = &this->item_list;
    ppQVar10 = QList<QLayoutItem_*>::data(this_00);
    pQVar1 = ppQVar10[3];
    if (pQVar1 == (QLayoutItem *)0x0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionDockWidget::QStyleOptionDockWidget((QStyleOptionDockWidget *)local_98);
      (**(code **)(*(long *)this_01 + 0x1a0))(this_01,(QStyleOptionDockWidget *)local_98);
      ppQVar10 = QList<QLayoutItem_*>::data(this_00);
      pQVar1 = ppQVar10[1];
      if (pQVar1 != (QLayoutItem *)0x0) {
        iVar8 = (*pQVar1->_vptr_QLayoutItem[8])(pQVar1);
        if ((char)iVar8 == '\0') {
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar9 = QWidget::style(this_01);
          local_a8 = (**(code **)(*(long *)pQVar9 + 0xc0))(pQVar9,0x1c,local_98,this_01);
          auVar12._0_4_ = -(uint)(local_a8._8_4_ == local_a8._0_4_ + -1);
          iVar8 = -(uint)(local_a8._12_4_ == local_a8._4_4_ + -1);
          auVar12._4_4_ = auVar12._0_4_;
          auVar12._8_4_ = iVar8;
          auVar12._12_4_ = iVar8;
          iVar8 = movmskpd(local_a8._0_4_,auVar12);
          if (iVar8 != 3) {
            (*pQVar1->_vptr_QLayoutItem[6])(pQVar1,local_a8);
          }
        }
      }
      ppQVar10 = QList<QLayoutItem_*>::data(this_00);
      pQVar1 = ppQVar10[2];
      if (pQVar1 != (QLayoutItem *)0x0) {
        iVar8 = (*pQVar1->_vptr_QLayoutItem[8])(pQVar1);
        if ((char)iVar8 == '\0') {
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar9 = QWidget::style(this_01);
          local_a8 = (**(code **)(*(long *)pQVar9 + 0xc0))(pQVar9,0x1d,local_98,this_01);
          auVar13._0_4_ = -(uint)(local_a8._8_4_ == local_a8._0_4_ + -1);
          iVar8 = -(uint)(local_a8._12_4_ == local_a8._4_4_ + -1);
          auVar13._4_4_ = auVar13._0_4_;
          auVar13._8_4_ = iVar8;
          auVar13._12_4_ = iVar8;
          iVar8 = movmskpd(local_a8._0_4_,auVar13);
          if (iVar8 != 3) {
            (*pQVar1->_vptr_QLayoutItem[6])(pQVar1,local_a8);
          }
        }
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_98);
    }
    else {
      (*pQVar1->_vptr_QLayoutItem[6])(pQVar1,&this->_titleArea);
    }
    ppQVar10 = QList<QLayoutItem_*>::data(this_00);
    if (*ppQVar10 != (QLayoutItem *)0x0) {
      uVar2 = geometry->x1;
      uVar3 = geometry->y1;
      uVar4 = geometry->x2;
      uVar5 = geometry->y2;
      if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
        local_98._0_4_ = (this->_titleArea).x2.m_i + 1;
        local_98._4_4_ = uVar3 + iVar7;
      }
      else {
        local_98._4_4_ = (this->_titleArea).y2.m_i + 1;
        local_98._0_4_ = uVar2 + iVar7;
      }
      local_98._8_8_ = CONCAT44(uVar5 - iVar7,uVar4 - iVar7);
      (*(*ppQVar10)->_vptr_QLayoutItem[6])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00406987:
  __stack_chk_fail();
}

Assistant:

void QDockWidgetLayout::setGeometry(const QRect &geometry)
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    bool nativeDeco = nativeWindowDeco();

    int fw = q->isFloating() && !nativeDeco
            ? q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q)
            : 0;

    if (nativeDeco) {
        if (QLayoutItem *item = item_list[Content])
            item->setGeometry(geometry);
    } else {
        int titleHeight = this->titleHeight();

        if (verticalTitleBar) {
            _titleArea = QRect(QPoint(fw, fw),
                                QSize(titleHeight, geometry.height() - (fw * 2)));
        } else {
            _titleArea = QRect(QPoint(fw, fw),
                                QSize(geometry.width() - (fw * 2), titleHeight));
        }

        if (QLayoutItem *item = item_list[TitleBar]) {
            item->setGeometry(_titleArea);
        } else {
            QStyleOptionDockWidget opt;
            q->initStyleOption(&opt);

            if (QLayoutItem *item = item_list[CloseButton]) {
                if (!item->isEmpty()) {
                    QRect r = q->style()
                        ->subElementRect(QStyle::SE_DockWidgetCloseButton,
                                            &opt, q);
                    if (!r.isNull())
                        item->setGeometry(r);
                }
            }

            if (QLayoutItem *item = item_list[FloatButton]) {
                if (!item->isEmpty()) {
                    QRect r = q->style()
                        ->subElementRect(QStyle::SE_DockWidgetFloatButton,
                                            &opt, q);
                    if (!r.isNull())
                        item->setGeometry(r);
                }
            }
        }

        if (QLayoutItem *item = item_list[Content]) {
            QRect r = geometry;
            if (verticalTitleBar) {
                r.setLeft(_titleArea.right() + 1);
                r.adjust(0, fw, -fw, -fw);
            } else {
                r.setTop(_titleArea.bottom() + 1);
                r.adjust(fw, 0, -fw, -fw);
            }
            item->setGeometry(r);
        }
    }
}